

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O0

void __thiscall Incppect<false>::stop(Incppect<false> *this)

{
  pointer pIVar1;
  unique_function<void_()> *in_RDI;
  Loop *in_stack_ffffffffffffffc0;
  anon_class_8_1_8991fb9c_for_value_ *in_stack_ffffffffffffffd8;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_()>_>
  *in_stack_ffffffffffffffe0;
  
  pIVar1 = std::unique_ptr<Incppect<false>::Impl,_std::default_delete<Incppect<false>::Impl>_>::
           operator->((unique_ptr<Incppect<false>::Impl,_std::default_delete<Incppect<false>::Impl>_>
                       *)0x214108);
  if (pIVar1->mainLoop != (Loop *)0x0) {
    std::unique_ptr<Incppect<false>::Impl,_std::default_delete<Incppect<false>::Impl>_>::operator->
              ((unique_ptr<Incppect<false>::Impl,_std::default_delete<Incppect<false>::Impl>_> *)
               0x21411c);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_()>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:534:33),_nullptr,_nullptr,_nullptr,_nullptr>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    uWS::Loop::defer(in_stack_ffffffffffffffc0,in_RDI);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_()>_>
    ::~function((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_()>_>
                 *)0x214162);
  }
  return;
}

Assistant:

void Incppect<SSL>::stop() {
    if (m_impl->mainLoop != nullptr) {
        m_impl->mainLoop->defer([this]() {
            for (auto sd : m_impl->socketData) {
                if (sd.second->mainLoop != nullptr) {
                    sd.second->mainLoop->defer([sd]() {
                        sd.second->ws->close();
                    });
                }
            }
            us_listen_socket_close(0, m_impl->listenSocket);
        });
    }
}